

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_JSONStringify(JSContext *ctx,JSValue obj,JSValue replacer,JSValue space0)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  int iVar3;
  uint uVar4;
  JSRefCountHeader *p_3;
  uint uVar5;
  int64_t iVar6;
  int64_t idx;
  ulong uVar7;
  int64_t iVar8;
  JSValueUnion JVar9;
  JSRefCountHeader *p_1;
  JSObject *p;
  ulong uVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue val;
  JSValue JVar13;
  ulong uStackY_130;
  int n_1;
  JSValue local_100;
  JSONStringifyContext jsc_s;
  long local_98;
  int64_t n;
  StringBuffer b_s;
  
  iVar8 = obj.tag;
  JVar9 = obj.u;
  jsc_s.replacer_func.u.float64 = jsc_s.replacer_func.u.float64 & 0xffffffff00000000;
  jsc_s.replacer_func.tag = 3;
  jsc_s.property_list.u.ptr = (void *)(jsc_s.property_list._4_8_ << 0x20);
  jsc_s.property_list.tag = 3;
  jsc_s.gap.u.ptr = (void *)(jsc_s.gap._4_8_ << 0x20);
  jsc_s.gap.tag = 3;
  jsc_s.b = &b_s;
  JVar11 = JS_AtomToString(ctx,0x2f);
  uVar5 = (uint)JVar11.tag;
  jsc_s.empty = JVar11;
  string_buffer_init(ctx,&b_s,0);
  jsc_s.stack = JS_NewArray(ctx);
  uStackY_130 = 6;
  if ((int)jsc_s.stack.tag == 6) {
LAB_0012844f:
    JVar11 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    iVar3 = JS_IsFunction(ctx,replacer);
    JVar1 = replacer.u;
    iVar2 = replacer.tag;
    if (iVar3 == 0) {
      iVar3 = JS_IsArray(ctx,replacer);
      if (-1 < iVar3) {
        JVar1 = jsc_s.replacer_func.u;
        iVar2 = jsc_s.replacer_func.tag;
        if (iVar3 == 0) goto LAB_001284f4;
        JVar13 = JS_NewArray(ctx);
        jsc_s.property_list = JVar13;
        if ((int)JVar13.tag != 6) {
          iVar3 = js_get_length64(ctx,&n,replacer);
          if (iVar3 == 0) {
            iVar6 = n;
            if (n < 1) {
              iVar6 = 0;
            }
            local_98 = 0;
            for (idx = 0; JVar1 = jsc_s.replacer_func.u, iVar2 = jsc_s.replacer_func.tag,
                iVar6 != idx; idx = idx + 1) {
              JVar12 = JS_GetPropertyInt64(ctx,replacer,idx);
              local_100 = JVar12;
              switch((int)JVar12.tag) {
              case 0:
              case 7:
switchD_00128622_caseD_0:
                JVar12 = JS_ToStringFree(ctx,JVar12);
                if ((int)JVar12.tag == 6) {
                  uStackY_130 = 6;
                  local_100 = JVar12;
                  goto LAB_0012844f;
                }
                break;
              default:
                if ((int)JVar12.tag != -7) goto LAB_001286e8;
                break;
              case 6:
                uStackY_130 = JVar12.tag & 0xffffffff;
                goto LAB_0012844f;
              case -1:
                if ((*(ushort *)((long)JVar12.u.ptr + 6) & 0xfffe) == 4)
                goto switchD_00128622_caseD_0;
                goto LAB_001286e8;
              }
              local_100 = JVar12;
              val = js_array_includes(ctx,JVar13,1,&local_100);
              if ((int)val.tag == 6) {
                JS_FreeValue(ctx,JVar12);
                JVar11 = (JSValue)(ZEXT816(3) << 0x40);
                uStackY_130 = 6;
                goto LAB_00128452;
              }
              iVar3 = JS_ToBoolFree(ctx,val);
              if (iVar3 == 0) {
                JS_SetPropertyInt64(ctx,JVar13,local_98,JVar12);
                local_98 = local_98 + 1;
              }
              else {
LAB_001286e8:
                JS_FreeValue(ctx,JVar12);
              }
            }
            goto LAB_001284f4;
          }
        }
      }
      goto LAB_0012844f;
    }
LAB_001284f4:
    jsc_s.replacer_func.tag = iVar2;
    jsc_s.replacer_func.u = JVar1;
    uStackY_130 = 6;
    if (0xfffffff4 < (uint)space0.tag) {
      *(int *)space0.u.ptr = *space0.u.ptr + 1;
    }
    if ((uint)space0.tag == 0xffffffff) {
      if (*(short *)((long)space0.u.ptr + 6) == 5) {
        space0 = JS_ToStringFree(ctx,space0);
      }
      else if (*(short *)((long)space0.u.ptr + 6) == 4) {
        space0 = JS_ToNumberFree(ctx,space0);
      }
      if ((int)space0.tag == 6) {
        JS_FreeValue(ctx,space0);
        goto LAB_0012844f;
      }
    }
    iVar3 = (int)space0.tag;
    if ((iVar3 == 7) || (iVar3 == 0)) {
      iVar3 = JS_ToInt32Clamp(ctx,&n_1,space0,0,10,0);
      if (iVar3 == 0) {
        jsc_s.gap = JS_NewStringLen(ctx,"          ",(long)n_1);
        goto LAB_001287b5;
      }
      goto LAB_0012844f;
    }
    if (iVar3 == -7) {
      uVar4 = *(uint *)((long)space0.u.ptr + 4) & 0x7fffffff;
      uVar5 = 10;
      if (uVar4 < 10) {
        uVar5 = uVar4;
      }
      jsc_s.gap = js_sub_string(ctx,(JSString *)space0.u.ptr,0,uVar5);
LAB_001287b5:
      uVar5 = (uint)jsc_s.gap.tag;
    }
    else {
      jsc_s.gap = JVar11;
      if (0xfffffff4 < uVar5) {
        *(int *)JVar11.u.ptr = *JVar11.u.ptr + 1;
      }
    }
    JS_FreeValue(ctx,space0);
    if (uVar5 == 6) goto LAB_0012844f;
    JVar11 = JS_NewObject(ctx);
    if ((int)JVar11.tag != 6) {
      if (0xfffffff4 < (uint)obj.tag) {
        *(int *)JVar9.ptr = *JVar9.ptr + 1;
      }
      iVar3 = JS_DefinePropertyValue(ctx,JVar11,0x2f,obj,7);
      if (-1 < iVar3) {
        if (0xfffffff4 < (uint)obj.tag) {
          *(int *)JVar9.ptr = *JVar9.ptr + 1;
        }
        JVar13 = js_json_check(ctx,&jsc_s,JVar11,obj,jsc_s.empty);
        if ((int)JVar13.tag == 3) {
          uStackY_130 = 3;
        }
        else if ((int)JVar13.tag == 6) {
          uStackY_130 = JVar13.tag & 0xffffffff;
        }
        else {
          JVar12.tag = iVar8;
          JVar12.u.ptr = JVar9.ptr;
          iVar3 = js_json_to_str(ctx,&jsc_s,JVar13,JVar12,jsc_s.empty);
          if (iVar3 == 0) {
            JVar13 = string_buffer_end(jsc_s.b);
            uStackY_130 = JVar13.tag;
            uVar7 = (ulong)JVar13.u.ptr & 0xffffffff00000000;
            uVar10 = (ulong)JVar13.u._0_4_;
            goto LAB_00128464;
          }
        }
      }
    }
  }
LAB_00128452:
  string_buffer_free(jsc_s.b);
  uVar10 = 0;
  uVar7 = 0;
LAB_00128464:
  JS_FreeValue(ctx,JVar11);
  JS_FreeValue(ctx,jsc_s.empty);
  JS_FreeValue(ctx,jsc_s.gap);
  JS_FreeValue(ctx,jsc_s.property_list);
  JS_FreeValue(ctx,jsc_s.stack);
  JVar11.tag = uStackY_130;
  JVar11.u.ptr = (void *)(uVar10 | uVar7);
  return JVar11;
}

Assistant:

JSValue JS_JSONStringify(JSContext *ctx, JSValueConst obj,
                         JSValueConst replacer, JSValueConst space0)
{
    StringBuffer b_s;
    JSONStringifyContext jsc_s, *jsc = &jsc_s;
    JSValue val, v, space, ret, wrapper;
    int res;
    int64_t i, j, n;

    jsc->replacer_func = JS_UNDEFINED;
    jsc->stack = JS_UNDEFINED;
    jsc->property_list = JS_UNDEFINED;
    jsc->gap = JS_UNDEFINED;
    jsc->b = &b_s;
    jsc->empty = JS_AtomToString(ctx, JS_ATOM_empty_string);
    ret = JS_UNDEFINED;
    wrapper = JS_UNDEFINED;

    string_buffer_init(ctx, jsc->b, 0);
    jsc->stack = JS_NewArray(ctx);
    if (JS_IsException(jsc->stack))
        goto exception;
    if (JS_IsFunction(ctx, replacer)) {
        jsc->replacer_func = replacer;
    } else {
        res = JS_IsArray(ctx, replacer);
        if (res < 0)
            goto exception;
        if (res) {
            /* XXX: enumeration is not fully correct */
            jsc->property_list = JS_NewArray(ctx);
            if (JS_IsException(jsc->property_list))
                goto exception;
            if (js_get_length64(ctx, &n, replacer))
                goto exception;
            for (i = j = 0; i < n; i++) {
                JSValue present;
                v = JS_GetPropertyInt64(ctx, replacer, i);
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsObject(v)) {
                    JSObject *p = JS_VALUE_GET_OBJ(v);
                    if (p->class_id == JS_CLASS_STRING ||
                        p->class_id == JS_CLASS_NUMBER) {
                        v = JS_ToStringFree(ctx, v);
                        if (JS_IsException(v))
                            goto exception;
                    } else {
                        JS_FreeValue(ctx, v);
                        continue;
                    }
                } else if (JS_IsNumber(v)) {
                    v = JS_ToStringFree(ctx, v);
                    if (JS_IsException(v))
                        goto exception;
                } else if (!JS_IsString(v)) {
                    JS_FreeValue(ctx, v);
                    continue;
                }
                present = js_array_includes(ctx, jsc->property_list,
                                            1, (JSValueConst *)&v);
                if (JS_IsException(present)) {
                    JS_FreeValue(ctx, v);
                    goto exception;
                }
                if (!JS_ToBoolFree(ctx, present)) {
                    JS_SetPropertyInt64(ctx, jsc->property_list, j++, v);
                } else {
                    JS_FreeValue(ctx, v);
                }
            }
        }
    }
    space = JS_DupValue(ctx, space0);
    if (JS_IsObject(space)) {
        JSObject *p = JS_VALUE_GET_OBJ(space);
        if (p->class_id == JS_CLASS_NUMBER) {
            space = JS_ToNumberFree(ctx, space);
        } else if (p->class_id == JS_CLASS_STRING) {
            space = JS_ToStringFree(ctx, space);
        }
        if (JS_IsException(space)) {
            JS_FreeValue(ctx, space);
            goto exception;
        }
    }
    if (JS_IsNumber(space)) {
        int n;
        if (JS_ToInt32Clamp(ctx, &n, space, 0, 10, 0))
            goto exception;
        jsc->gap = JS_NewStringLen(ctx, "          ", n);
    } else if (JS_IsString(space)) {
        JSString *p = JS_VALUE_GET_STRING(space);
        jsc->gap = js_sub_string(ctx, p, 0, min_int(p->len, 10));
    } else {
        jsc->gap = JS_DupValue(ctx, jsc->empty);
    }
    JS_FreeValue(ctx, space);
    if (JS_IsException(jsc->gap))
        goto exception;
    wrapper = JS_NewObject(ctx);
    if (JS_IsException(wrapper))
        goto exception;
    if (JS_DefinePropertyValue(ctx, wrapper, JS_ATOM_empty_string,
                               JS_DupValue(ctx, obj), JS_PROP_C_W_E) < 0)
        goto exception;
    val = JS_DupValue(ctx, obj);
                           
    val = js_json_check(ctx, jsc, wrapper, val, jsc->empty);
    if (JS_IsException(val))
        goto exception;
    if (JS_IsUndefined(val)) {
        ret = JS_UNDEFINED;
        goto done1;
    }
    if (js_json_to_str(ctx, jsc, wrapper, val, jsc->empty))
        goto exception;

    ret = string_buffer_end(jsc->b);
    goto done;

exception:
    ret = JS_EXCEPTION;
done1:
    string_buffer_free(jsc->b);
done:
    JS_FreeValue(ctx, wrapper);
    JS_FreeValue(ctx, jsc->empty);
    JS_FreeValue(ctx, jsc->gap);
    JS_FreeValue(ctx, jsc->property_list);
    JS_FreeValue(ctx, jsc->stack);
    return ret;
}